

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

void Transform(uint64_t *s,uint64_t *chunk)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  ulong w;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong w_00;
  ulong w_01;
  ulong w_02;
  ulong w_03;
  ulong w_04;
  ulong w_05;
  ulong w_06;
  ulong w_07;
  ulong w_08;
  ulong w_09;
  ulong w_10;
  ulong w_11;
  ulong uVar20;
  ulong w_12;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint64_t e;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t local_c0;
  uint64_t local_b8;
  uint64_t g;
  uint64_t f;
  uint64_t h;
  uint64_t d;
  uint64_t local_90;
  uint64_t local_88;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t *local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  uVar1 = *s;
  uVar2 = s[1];
  c = s[2];
  d = s[3];
  uVar3 = s[4];
  f = s[5];
  g = s[6];
  h = s[7];
  uVar9 = *chunk;
  w = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
      (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
      (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  e = uVar3;
  b = uVar2;
  a = uVar1;
  local_78 = f;
  local_60 = uVar2;
  local_58 = c;
  local_50 = g;
  local_48 = s;
  local_40 = h;
  local_38 = d;
  Round(uVar1,uVar2,c,&d,uVar3,f,g,&h,0x428a2f98d728ae22,w);
  uVar6 = d;
  uVar4 = h;
  uVar9 = chunk[1];
  uVar11 = uVar9 >> 0x38;
  w_00 = uVar11 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  local_70 = uVar1;
  local_68 = uVar3;
  Round(h,uVar1,uVar2,&c,d,uVar3,local_78,&g,0x7137449123ef65cd,w_00);
  uVar5 = g;
  uVar2 = c;
  uVar9 = chunk[2];
  uVar12 = uVar9 >> 0x38;
  w_01 = uVar12 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  Round(g,uVar4,uVar1,&b,c,uVar6,uVar3,&f,0xb5c0fbcfec4d3b2f,w_01);
  uVar3 = b;
  local_90 = f;
  uVar9 = chunk[3];
  uVar13 = uVar9 >> 0x38;
  w_02 = uVar13 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  Round(f,uVar5,uVar4,&a,b,uVar2,uVar6,&e,0xe9b5dba58189dbbc,w_02);
  uVar6 = local_90;
  uVar4 = a;
  uVar1 = e;
  uVar9 = chunk[4];
  uVar14 = uVar9 >> 0x38;
  w_03 = uVar14 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  local_b8 = e;
  Round(e,local_90,uVar5,&h,a,uVar3,uVar2,&d,0x3956c25bf348b538,w_03);
  uVar8 = d;
  uVar7 = h;
  uVar9 = chunk[5];
  uVar15 = uVar9 >> 0x38;
  w_04 = uVar15 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  Round(d,uVar1,uVar6,&g,h,uVar4,uVar3,&c,0x59f111f1b605d019,w_04);
  uVar5 = g;
  uVar2 = c;
  uVar9 = chunk[6];
  uVar16 = uVar9 >> 0x38;
  w_05 = uVar16 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  Round(c,uVar8,local_b8,&f,g,uVar7,uVar4,&b,0x923f82a4af194f9b,w_05);
  uVar6 = f;
  local_c0 = b;
  uVar9 = chunk[7];
  local_90 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
             (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
             (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  Round(b,uVar2,uVar8,&e,f,uVar5,uVar7,&a,0xab1c5ed5da6d8118,local_90);
  uVar4 = local_c0;
  uVar3 = a;
  uVar1 = e;
  uVar9 = chunk[8];
  uVar20 = uVar9 >> 0x38;
  w_06 = uVar20 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  Round(a,local_c0,uVar2,&d,e,uVar6,uVar5,&h,0xd807aa98a3030242,w_06);
  uVar8 = d;
  uVar7 = h;
  uVar9 = chunk[9];
  uVar17 = uVar9 >> 0x38;
  w_07 = uVar17 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  local_b8 = d;
  Round(h,uVar3,uVar4,&c,d,uVar1,uVar6,&g,0x12835b0145706fbe,w_07);
  uVar5 = g;
  uVar2 = c;
  uVar9 = chunk[10];
  uVar18 = uVar9 >> 0x38;
  w_08 = uVar18 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  local_c0 = c;
  Round(g,uVar7,uVar3,&b,c,uVar8,uVar1,&f,0x243185be4ee4b28c,w_08);
  uVar6 = f;
  uVar3 = b;
  uVar9 = chunk[0xb];
  uVar19 = uVar9 >> 0x38;
  w_09 = uVar19 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  Round(f,uVar5,uVar7,&a,b,uVar2,local_b8,&e,0x550c7dc3d5ffb4e2,w_09);
  uVar4 = a;
  uVar1 = e;
  uVar9 = chunk[0xc];
  uVar23 = uVar9 >> 0x38;
  w_10 = uVar23 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  Round(e,uVar6,uVar5,&h,a,uVar3,local_c0,&d,0x72be5d74f27b896f,w_10);
  uVar8 = d;
  uVar7 = h;
  uVar9 = chunk[0xd];
  local_b8 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
             (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
             (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  Round(d,uVar1,uVar6,&g,h,uVar4,uVar3,&c,0x80deb1fe3b1696b1,local_b8);
  uVar5 = g;
  uVar2 = c;
  uVar9 = chunk[0xe];
  uVar21 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18;
  w_11 = uVar21 | (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 |
         (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
  Round(c,uVar8,uVar1,&f,g,uVar7,uVar4,&b,0x9bdc06a725c71235,w_11);
  uVar6 = f;
  uVar3 = b;
  uVar10 = chunk[0xf];
  uVar24 = uVar10 >> 0x38;
  uVar22 = uVar24 | (uVar10 & 0xff000000000000) >> 0x28 | (uVar10 & 0xff0000000000) >> 0x18;
  w_12 = uVar22 | (uVar10 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 |
         (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
  Round(b,uVar2,uVar8,&e,f,uVar5,uVar7,&a,0xc19bf174cf692694,w_12);
  uVar4 = a;
  uVar1 = e;
  uVar9 = w + w_07 +
          (w_00 >> 7 ^
          (uVar11 << 0x38 | w_00 >> 8) ^ (w_00 >> 1 | (ulong)((uVar11 & 1) != 0) << 0x3f)) +
          (w_11 >> 6 ^ (w_11 << 3 | (uVar9 << 0x38) >> 0x3d) ^ (uVar21 << 0x2d | w_11 >> 0x13));
  local_c0 = w_11;
  Round(a,uVar3,uVar2,&d,e,uVar6,uVar5,&h,0xe49b69c19ef14ad2,uVar9);
  uVar8 = d;
  uVar7 = h;
  uVar10 = w_00 + w_08 +
           (w_01 >> 7 ^
           (uVar12 << 0x38 | w_01 >> 8) ^ (w_01 >> 1 | (ulong)((uVar12 & 1) != 0) << 0x3f)) +
           (w_12 >> 6 ^ (w_12 << 3 | (uVar10 << 0x38) >> 0x3d) ^ (uVar22 << 0x2d | w_12 >> 0x13));
  Round(h,uVar4,uVar3,&c,d,uVar1,uVar6,&g,0xefbe4786384f25e3,uVar10);
  uVar5 = g;
  uVar2 = c;
  uVar11 = w_01 + w_09 +
           (w_02 >> 7 ^
           (uVar13 << 0x38 | w_02 >> 8) ^ (w_02 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f)) +
           (uVar9 >> 6 ^ (uVar9 * 8 | uVar9 >> 0x3d) ^ (uVar9 << 0x2d | uVar9 >> 0x13));
  Round(g,uVar7,uVar4,&b,c,uVar8,uVar1,&f,0xfc19dc68b8cd5b5,uVar11);
  uVar6 = f;
  uVar3 = b;
  uVar12 = w_02 + w_10 +
           (w_03 >> 7 ^
           (uVar14 << 0x38 | w_03 >> 8) ^ (w_03 >> 1 | (ulong)((uVar14 & 1) != 0) << 0x3f)) +
           (uVar10 >> 6 ^ (uVar10 * 8 | uVar10 >> 0x3d) ^ (uVar10 << 0x2d | uVar10 >> 0x13));
  Round(f,uVar5,uVar7,&a,b,uVar2,uVar8,&e,0x240ca1cc77ac9c65,uVar12);
  uVar4 = a;
  uVar1 = e;
  uVar21 = w_03 + local_b8 +
           (w_04 >> 7 ^
           (uVar15 << 0x38 | w_04 >> 8) ^ (w_04 >> 1 | (ulong)((uVar15 & 1) != 0) << 0x3f)) +
           (uVar11 >> 6 ^ (uVar11 * 8 | uVar11 >> 0x3d) ^ (uVar11 << 0x2d | uVar11 >> 0x13));
  Round(e,uVar6,uVar5,&h,a,uVar3,uVar2,&d,0x2de92c6f592b0275,uVar21);
  uVar7 = h;
  local_88 = d;
  uVar13 = w_04 + local_c0 +
           (w_05 >> 7 ^
           (uVar16 << 0x38 | w_05 >> 8) ^ (w_05 >> 1 | (ulong)((uVar16 & 1) != 0) << 0x3f)) +
           (uVar12 >> 6 ^ (uVar12 * 8 | uVar12 >> 0x3d) ^ (uVar12 << 0x2d | uVar12 >> 0x13));
  Round(d,uVar1,uVar6,&g,h,uVar4,uVar3,&c,0x4a7484aa6ea6e483,uVar13);
  uVar8 = local_88;
  uVar5 = g;
  uVar2 = c;
  uVar14 = w_05 + w_12 +
           (local_90 >> 7 ^
           (local_90 << 0x38 | local_90 >> 8) ^
           (local_90 >> 1 | (ulong)((local_90 & 1) != 0) << 0x3f)) +
           (uVar21 >> 6 ^ (uVar21 * 8 | uVar21 >> 0x3d) ^ (uVar21 << 0x2d | uVar21 >> 0x13));
  Round(c,local_88,uVar1,&f,g,uVar7,uVar4,&b,0x5cb0a9dcbd41fbd4,uVar14);
  uVar6 = f;
  uVar3 = b;
  uVar20 = (w_06 >> 7 ^
           (uVar20 << 0x38 | w_06 >> 8) ^ (w_06 >> 1 | (ulong)((uVar20 & 1) != 0) << 0x3f)) +
           local_90 + uVar9 +
           (uVar13 >> 6 ^ (uVar13 * 8 | uVar13 >> 0x3d) ^ (uVar13 << 0x2d | uVar13 >> 0x13));
  Round(b,uVar2,uVar8,&e,f,uVar5,uVar7,&a,0x76f988da831153b5,uVar20);
  uVar4 = a;
  uVar1 = e;
  uVar15 = (w_07 >> 7 ^
           (uVar17 << 0x38 | w_07 >> 8) ^ (w_07 >> 1 | (ulong)((uVar17 & 1) != 0) << 0x3f)) + w_06 +
           uVar10 + (uVar14 >> 6 ^ (uVar14 * 8 | uVar14 >> 0x3d) ^ (uVar14 << 0x2d | uVar14 >> 0x13)
                    );
  Round(a,uVar3,uVar2,&d,e,uVar6,uVar5,&h,0x983e5152ee66dfab,uVar15);
  uVar8 = d;
  uVar7 = h;
  uVar16 = (w_08 >> 7 ^
           (uVar18 << 0x38 | w_08 >> 8) ^ (w_08 >> 1 | (ulong)((uVar18 & 1) != 0) << 0x3f)) + w_07 +
           uVar11 + (uVar20 >> 6 ^ (uVar20 * 8 | uVar20 >> 0x3d) ^ (uVar20 << 0x2d | uVar20 >> 0x13)
                    );
  local_90 = uVar20;
  Round(h,uVar4,uVar3,&c,d,uVar1,uVar6,&g,0xa831c66d2db43210,uVar16);
  uVar5 = g;
  uVar2 = c;
  uVar22 = (w_09 >> 7 ^
           (uVar19 << 0x38 | w_09 >> 8) ^ (w_09 >> 1 | (ulong)((uVar19 & 1) != 0) << 0x3f)) + w_08 +
           uVar12 + (uVar15 >> 6 ^ (uVar15 * 8 | uVar15 >> 0x3d) ^ (uVar15 << 0x2d | uVar15 >> 0x13)
                    );
  Round(g,uVar7,uVar4,&b,c,uVar8,uVar1,&f,0xb00327c898fb213f,uVar22);
  uVar6 = f;
  uVar3 = b;
  uVar20 = (w_10 >> 7 ^
           (uVar23 << 0x38 | w_10 >> 8) ^ (w_10 >> 1 | (ulong)((uVar23 & 1) != 0) << 0x3f)) + w_09 +
           uVar21 + (uVar16 >> 6 ^ (uVar16 * 8 | uVar16 >> 0x3d) ^ (uVar16 << 0x2d | uVar16 >> 0x13)
                    );
  Round(f,uVar5,uVar7,&a,b,uVar2,uVar8,&e,0xbf597fc7beef0ee4,uVar20);
  uVar4 = a;
  uVar1 = e;
  uVar17 = (local_b8 >> 7 ^
           (local_b8 << 0x38 | local_b8 >> 8) ^
           (local_b8 >> 1 | (ulong)((local_b8 & 1) != 0) << 0x3f)) + w_10 + uVar13 +
           (uVar22 >> 6 ^ (uVar22 * 8 | uVar22 >> 0x3d) ^ (uVar22 << 0x2d | uVar22 >> 0x13));
  Round(e,uVar6,uVar5,&h,a,uVar3,uVar2,&d,0xc6e00bf33da88fc2,uVar17);
  uVar8 = d;
  uVar7 = h;
  uVar19 = (local_c0 >> 7 ^
           (local_c0 << 0x38 | local_c0 >> 8) ^
           (local_c0 >> 1 | (ulong)((local_c0 & 1) != 0) << 0x3f)) + local_b8 + uVar14 +
           (uVar20 >> 6 ^ (uVar20 * 8 | uVar20 >> 0x3d) ^ (uVar20 << 0x2d | uVar20 >> 0x13));
  Round(d,uVar1,uVar6,&g,h,uVar4,uVar3,&c,0xd5a79147930aa725,uVar19);
  uVar5 = g;
  uVar2 = c;
  local_b8 = (w_12 >> 7 ^
             (uVar24 << 0x38 | w_12 >> 8) ^ (w_12 >> 1 | (ulong)((uVar24 & 1) != 0) << 0x3f)) +
             local_c0 + local_90 +
             (uVar17 >> 6 ^ (uVar17 * 8 | uVar17 >> 0x3d) ^ (uVar17 << 0x2d | uVar17 >> 0x13));
  Round(c,uVar8,uVar1,&f,g,uVar7,uVar4,&b,0x6ca6351e003826f,local_b8);
  uVar6 = f;
  uVar3 = b;
  uVar18 = (uVar9 >> 7 ^
           (uVar9 << 0x38 | uVar9 >> 8) ^ (uVar9 >> 1 | (ulong)((uVar9 & 1) != 0) << 0x3f)) + w_12 +
           uVar15 + (uVar19 >> 6 ^ (uVar19 * 8 | uVar19 >> 0x3d) ^ (uVar19 << 0x2d | uVar19 >> 0x13)
                    );
  Round(b,uVar2,uVar8,&e,f,uVar5,uVar7,&a,0x142929670a0e6e70,uVar18);
  uVar4 = a;
  uVar1 = e;
  uVar23 = (uVar10 >> 7 ^
           (uVar10 << 0x38 | uVar10 >> 8) ^ (uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f)) +
           uVar9 + uVar16 +
           (local_b8 >> 6 ^
           (local_b8 << 3 | local_b8 >> 0x3d) ^ (local_b8 << 0x2d | local_b8 >> 0x13));
  Round(a,uVar3,uVar2,&d,e,uVar6,uVar5,&h,0x27b70a8546d22ffc,uVar23);
  uVar8 = d;
  uVar7 = h;
  uVar9 = (uVar11 >> 7 ^
          (uVar11 << 0x38 | uVar11 >> 8) ^ (uVar11 >> 1 | (ulong)((uVar11 & 1) != 0) << 0x3f)) +
          uVar10 + uVar22 +
          (uVar18 >> 6 ^ (uVar18 * 8 | uVar18 >> 0x3d) ^ (uVar18 << 0x2d | uVar18 >> 0x13));
  Round(h,uVar4,uVar3,&c,d,uVar1,uVar6,&g,0x2e1b21385c26c926,uVar9);
  uVar5 = g;
  uVar2 = c;
  uVar10 = (uVar12 >> 7 ^
           (uVar12 << 0x38 | uVar12 >> 8) ^ (uVar12 >> 1 | (ulong)((uVar12 & 1) != 0) << 0x3f)) +
           uVar11 + uVar20 +
           (uVar23 >> 6 ^ (uVar23 * 8 | uVar23 >> 0x3d) ^ (uVar23 << 0x2d | uVar23 >> 0x13));
  local_c0 = uVar23;
  Round(g,uVar7,uVar4,&b,c,uVar8,uVar1,&f,0x4d2c6dfc5ac42aed,uVar10);
  uVar6 = f;
  uVar3 = b;
  uVar23 = (uVar21 >> 7 ^
           (uVar21 << 0x38 | uVar21 >> 8) ^ (uVar21 >> 1 | (ulong)((uVar21 & 1) != 0) << 0x3f)) +
           uVar12 + uVar17 +
           (uVar9 >> 6 ^ (uVar9 * 8 | uVar9 >> 0x3d) ^ (uVar9 << 0x2d | uVar9 >> 0x13));
  Round(f,uVar5,uVar7,&a,b,uVar2,uVar8,&e,0x53380d139d95b3df,uVar23);
  uVar4 = a;
  uVar1 = e;
  uVar11 = (uVar13 >> 7 ^
           (uVar13 << 0x38 | uVar13 >> 8) ^ (uVar13 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f)) +
           uVar21 + uVar19 +
           (uVar10 >> 6 ^ (uVar10 * 8 | uVar10 >> 0x3d) ^ (uVar10 << 0x2d | uVar10 >> 0x13));
  Round(e,uVar6,uVar5,&h,a,uVar3,uVar2,&d,0x650a73548baf63de,uVar11);
  uVar7 = d;
  uVar5 = h;
  uVar12 = (uVar14 >> 7 ^
           (uVar14 << 0x38 | uVar14 >> 8) ^ (uVar14 >> 1 | (ulong)((uVar14 & 1) != 0) << 0x3f)) +
           uVar13 + local_b8 +
           (uVar23 >> 6 ^ (uVar23 * 8 | uVar23 >> 0x3d) ^ (uVar23 << 0x2d | uVar23 >> 0x13));
  Round(d,uVar1,uVar6,&g,h,uVar4,uVar3,&c,0x766a0abb3c77b2a8,uVar12);
  uVar2 = g;
  local_88 = c;
  uVar24 = (local_90 >> 7 ^
           (local_90 << 0x38 | local_90 >> 8) ^
           (local_90 >> 1 | (ulong)((local_90 & 1) != 0) << 0x3f)) + uVar14 + uVar18 +
           (uVar11 >> 6 ^ (uVar11 * 8 | uVar11 >> 0x3d) ^ (uVar11 << 0x2d | uVar11 >> 0x13));
  Round(c,uVar7,uVar1,&f,g,uVar5,uVar4,&b,0x81c2c92e47edaee6,uVar24);
  uVar6 = local_88;
  uVar4 = f;
  local_80 = b;
  uVar13 = (uVar15 >> 7 ^
           (uVar15 << 0x38 | uVar15 >> 8) ^ (uVar15 >> 1 | (ulong)((uVar15 & 1) != 0) << 0x3f)) +
           local_90 + local_c0 +
           (uVar12 >> 6 ^ (uVar12 * 8 | uVar12 >> 0x3d) ^ (uVar12 << 0x2d | uVar12 >> 0x13));
  Round(b,local_88,uVar7,&e,f,uVar2,uVar5,&a,0x92722c851482353b,uVar13);
  uVar5 = local_80;
  uVar3 = a;
  uVar1 = e;
  uVar14 = (uVar16 >> 7 ^
           (uVar16 << 0x38 | uVar16 >> 8) ^ (uVar16 >> 1 | (ulong)((uVar16 & 1) != 0) << 0x3f)) +
           uVar15 + uVar9 +
           (uVar24 >> 6 ^ (uVar24 * 8 | uVar24 >> 0x3d) ^ (uVar24 << 0x2d | uVar24 >> 0x13));
  Round(a,local_80,uVar6,&d,e,uVar4,uVar2,&h,0xa2bfe8a14cf10364,uVar14);
  uVar6 = d;
  local_88 = h;
  uVar21 = (uVar22 >> 7 ^
           (uVar22 << 0x38 | uVar22 >> 8) ^ (uVar22 >> 1 | (ulong)((uVar22 & 1) != 0) << 0x3f)) +
           uVar16 + uVar10 +
           (uVar13 >> 6 ^ (uVar13 * 8 | uVar13 >> 0x3d) ^ (uVar13 << 0x2d | uVar13 >> 0x13));
  Round(h,uVar3,uVar5,&c,d,uVar1,uVar4,&g,0xa81a664bbc423001,uVar21);
  uVar4 = local_88;
  uVar2 = c;
  local_80 = g;
  uVar15 = (uVar20 >> 7 ^
           (uVar20 << 0x38 | uVar20 >> 8) ^ (uVar20 >> 1 | (ulong)((uVar20 & 1) != 0) << 0x3f)) +
           uVar22 + uVar23 +
           (uVar14 >> 6 ^ (uVar14 * 8 | uVar14 >> 0x3d) ^ (uVar14 << 0x2d | uVar14 >> 0x13));
  Round(g,local_88,uVar3,&b,c,uVar6,uVar1,&f,0xc24b8b70d0f89791,uVar15);
  uVar7 = local_80;
  uVar5 = f;
  uVar3 = b;
  uVar16 = (uVar17 >> 7 ^
           (uVar17 << 0x38 | uVar17 >> 8) ^ (uVar17 >> 1 | (ulong)((uVar17 & 1) != 0) << 0x3f)) +
           uVar20 + uVar11 +
           (uVar21 >> 6 ^ (uVar21 * 8 | uVar21 >> 0x3d) ^ (uVar21 << 0x2d | uVar21 >> 0x13));
  local_90 = uVar21;
  Round(f,local_80,uVar4,&a,b,uVar2,uVar6,&e,0xc76c51a30654be30,uVar16);
  uVar4 = a;
  uVar1 = e;
  uVar21 = (uVar19 >> 7 ^
           (uVar19 << 0x38 | uVar19 >> 8) ^ (uVar19 >> 1 | (ulong)((uVar19 & 1) != 0) << 0x3f)) +
           uVar17 + uVar12 +
           (uVar15 >> 6 ^ (uVar15 * 8 | uVar15 >> 0x3d) ^ (uVar15 << 0x2d | uVar15 >> 0x13));
  Round(e,uVar5,uVar7,&h,a,uVar3,uVar2,&d,0xd192e819d6ef5218,uVar21);
  uVar6 = h;
  local_88 = d;
  uVar20 = (local_b8 >> 7 ^
           (local_b8 << 0x38 | local_b8 >> 8) ^
           (local_b8 >> 1 | (ulong)((local_b8 & 1) != 0) << 0x3f)) + uVar19 + uVar24 +
           (uVar16 >> 6 ^ (uVar16 * 8 | uVar16 >> 0x3d) ^ (uVar16 << 0x2d | uVar16 >> 0x13));
  Round(d,uVar1,uVar5,&g,h,uVar4,uVar3,&c,0xd69906245565a910,uVar20);
  uVar7 = local_88;
  uVar5 = g;
  uVar2 = c;
  uVar17 = (uVar18 >> 7 ^
           (uVar18 << 0x38 | uVar18 >> 8) ^ (uVar18 >> 1 | (ulong)((uVar18 & 1) != 0) << 0x3f)) +
           local_b8 + uVar13 +
           (uVar21 >> 6 ^ (uVar21 * 8 | uVar21 >> 0x3d) ^ (uVar21 << 0x2d | uVar21 >> 0x13));
  Round(c,local_88,uVar1,&f,g,uVar6,uVar4,&b,0xf40e35855771202a,uVar17);
  uVar4 = f;
  uVar3 = b;
  uVar19 = (local_c0 >> 7 ^
           (local_c0 << 0x38 | local_c0 >> 8) ^
           (local_c0 >> 1 | (ulong)((local_c0 & 1) != 0) << 0x3f)) + uVar18 + uVar14 +
           (uVar20 >> 6 ^ (uVar20 * 8 | uVar20 >> 0x3d) ^ (uVar20 << 0x2d | uVar20 >> 0x13));
  Round(b,uVar2,uVar7,&e,f,uVar5,uVar6,&a,0x106aa07032bbd1b8,uVar19);
  uVar1 = e;
  local_88 = a;
  uVar18 = (uVar9 >> 7 ^
           (uVar9 << 0x38 | uVar9 >> 8) ^ (uVar9 >> 1 | (ulong)((uVar9 & 1) != 0) << 0x3f)) +
           local_c0 + local_90 +
           (uVar17 >> 6 ^ (uVar17 * 8 | uVar17 >> 0x3d) ^ (uVar17 << 0x2d | uVar17 >> 0x13));
  Round(a,uVar3,uVar2,&d,e,uVar4,uVar5,&h,0x19a4c116b8d2d0c8,uVar18);
  uVar8 = local_88;
  uVar7 = d;
  uVar6 = h;
  uVar9 = (uVar10 >> 7 ^
          (uVar10 << 0x38 | uVar10 >> 8) ^ (uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f)) +
          uVar9 + uVar15 +
          (uVar19 >> 6 ^ (uVar19 * 8 | uVar19 >> 0x3d) ^ (uVar19 << 0x2d | uVar19 >> 0x13));
  local_c0 = h;
  local_b8 = uVar19;
  Round(h,local_88,uVar3,&c,d,uVar1,uVar4,&g,0x1e376c085141ab53,uVar9);
  uVar5 = g;
  uVar2 = c;
  uVar22 = (uVar23 >> 7 ^
           (uVar23 << 0x38 | uVar23 >> 8) ^ (uVar23 >> 1 | (ulong)((uVar23 & 1) != 0) << 0x3f)) +
           uVar10 + uVar16 +
           (uVar18 >> 6 ^ (uVar18 * 8 | uVar18 >> 0x3d) ^ (uVar18 << 0x2d | uVar18 >> 0x13));
  Round(g,uVar6,uVar8,&b,c,uVar7,uVar1,&f,0x2748774cdf8eeb99,uVar22);
  uVar6 = f;
  uVar3 = b;
  uVar10 = (uVar11 >> 7 ^
           (uVar11 << 0x38 | uVar11 >> 8) ^ (uVar11 >> 1 | (ulong)((uVar11 & 1) != 0) << 0x3f)) +
           uVar23 + uVar21 +
           (uVar9 >> 6 ^ (uVar9 * 8 | uVar9 >> 0x3d) ^ (uVar9 << 0x2d | uVar9 >> 0x13));
  Round(f,uVar5,local_c0,&a,b,uVar2,uVar7,&e,0x34b0bcb5e19b48a8,uVar10);
  uVar4 = a;
  uVar1 = e;
  uVar11 = (uVar12 >> 7 ^
           (uVar12 << 0x38 | uVar12 >> 8) ^ (uVar12 >> 1 | (ulong)((uVar12 & 1) != 0) << 0x3f)) +
           uVar11 + uVar20 +
           (uVar22 >> 6 ^ (uVar22 * 8 | uVar22 >> 0x3d) ^ (uVar22 << 0x2d | uVar22 >> 0x13));
  local_c0 = a;
  Round(e,uVar6,uVar5,&h,a,uVar3,uVar2,&d,0x391c0cb3c5c95a63,uVar11);
  uVar7 = h;
  local_88 = d;
  uVar19 = (uVar24 >> 7 ^
           (uVar24 << 0x38 | uVar24 >> 8) ^ (uVar24 >> 1 | (ulong)((uVar24 & 1) != 0) << 0x3f)) +
           uVar12 + uVar17 +
           (uVar10 >> 6 ^ (uVar10 * 8 | uVar10 >> 0x3d) ^ (uVar10 << 0x2d | uVar10 >> 0x13));
  Round(d,uVar1,uVar6,&g,h,uVar4,uVar3,&c,0x4ed8aa4ae3418acb,uVar19);
  uVar6 = local_88;
  uVar4 = g;
  uVar2 = c;
  uVar12 = (uVar13 >> 7 ^
           (uVar13 << 0x38 | uVar13 >> 8) ^ (uVar13 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f)) +
           uVar24 + local_b8 +
           (uVar11 >> 6 ^ (uVar11 * 8 | uVar11 >> 0x3d) ^ (uVar11 << 0x2d | uVar11 >> 0x13));
  Round(c,local_88,uVar1,&f,g,uVar7,local_c0,&b,0x5b9cca4f7763e373,uVar12);
  uVar5 = f;
  uVar3 = b;
  uVar13 = (uVar14 >> 7 ^
           (uVar14 << 0x38 | uVar14 >> 8) ^ (uVar14 >> 1 | (ulong)((uVar14 & 1) != 0) << 0x3f)) +
           uVar13 + uVar18 +
           (uVar19 >> 6 ^ (uVar19 * 8 | uVar19 >> 0x3d) ^ (uVar19 << 0x2d | uVar19 >> 0x13));
  Round(b,uVar2,uVar6,&e,f,uVar4,uVar7,&a,0x682e6ff3d6b2b8a3,uVar13);
  uVar1 = e;
  local_88 = a;
  uVar23 = (local_90 >> 7 ^
           (local_90 << 0x38 | local_90 >> 8) ^
           (local_90 >> 1 | (ulong)((local_90 & 1) != 0) << 0x3f)) + uVar14 + uVar9 +
           (uVar12 >> 6 ^ (uVar12 * 8 | uVar12 >> 0x3d) ^ (uVar12 << 0x2d | uVar12 >> 0x13));
  Round(a,uVar3,uVar2,&d,e,uVar5,uVar4,&h,0x748f82ee5defb2fc,uVar23);
  uVar7 = local_88;
  uVar6 = d;
  uVar4 = h;
  uVar14 = (uVar15 >> 7 ^
           (uVar15 << 0x38 | uVar15 >> 8) ^ (uVar15 >> 1 | (ulong)((uVar15 & 1) != 0) << 0x3f)) +
           local_90 + uVar22 +
           (uVar13 >> 6 ^ (uVar13 * 8 | uVar13 >> 0x3d) ^ (uVar13 << 0x2d | uVar13 >> 0x13));
  Round(h,local_88,uVar3,&c,d,uVar1,uVar5,&g,0x78a5636f43172f60,uVar14);
  uVar5 = g;
  uVar2 = c;
  uVar15 = (uVar16 >> 7 ^
           (uVar16 << 0x38 | uVar16 >> 8) ^ (uVar16 >> 1 | (ulong)((uVar16 & 1) != 0) << 0x3f)) +
           uVar15 + uVar10 +
           (uVar23 >> 6 ^ (uVar23 * 8 | uVar23 >> 0x3d) ^ (uVar23 << 0x2d | uVar23 >> 0x13));
  local_c0 = uVar23;
  Round(g,uVar4,uVar7,&b,c,uVar6,uVar1,&f,0x84c87814a1f0ab72,uVar15);
  uVar3 = b;
  local_88 = f;
  uVar23 = (uVar21 >> 7 ^
           (uVar21 << 0x38 | uVar21 >> 8) ^ (uVar21 >> 1 | (ulong)((uVar21 & 1) != 0) << 0x3f)) +
           uVar16 + uVar11 +
           (uVar14 >> 6 ^ (uVar14 * 8 | uVar14 >> 0x3d) ^ (uVar14 << 0x2d | uVar14 >> 0x13));
  Round(f,uVar5,uVar4,&a,b,uVar2,uVar6,&e,0x8cc702081a6439ec,uVar23);
  uVar6 = local_88;
  uVar4 = a;
  uVar1 = e;
  uVar16 = (uVar20 >> 7 ^
           (uVar20 << 0x38 | uVar20 >> 8) ^ (uVar20 >> 1 | (ulong)((uVar20 & 1) != 0) << 0x3f)) +
           uVar21 + uVar19 +
           (uVar15 >> 6 ^ (uVar15 * 8 | uVar15 >> 0x3d) ^ (uVar15 << 0x2d | uVar15 >> 0x13));
  Round(e,local_88,uVar5,&h,a,uVar3,uVar2,&d,0x90befffa23631e28,uVar16);
  uVar8 = d;
  uVar7 = h;
  uVar20 = (uVar17 >> 7 ^
           (uVar17 << 0x38 | uVar17 >> 8) ^ (uVar17 >> 1 | (ulong)((uVar17 & 1) != 0) << 0x3f)) +
           uVar20 + uVar12 +
           (uVar23 >> 6 ^ (uVar23 * 8 | uVar23 >> 0x3d) ^ (uVar23 << 0x2d | uVar23 >> 0x13));
  local_90 = uVar23;
  Round(d,uVar1,uVar6,&g,h,uVar4,uVar3,&c,0xa4506cebde82bde9,uVar20);
  uVar5 = g;
  uVar2 = c;
  uVar17 = (local_b8 >> 7 ^
           (local_b8 << 0x38 | local_b8 >> 8) ^
           (local_b8 >> 1 | (ulong)((local_b8 & 1) != 0) << 0x3f)) + uVar17 + uVar13 +
           (uVar16 >> 6 ^ (uVar16 * 8 | uVar16 >> 0x3d) ^ (uVar16 << 0x2d | uVar16 >> 0x13));
  Round(c,uVar8,uVar1,&f,g,uVar7,uVar4,&b,0xbef9a3f7b2c67915,uVar17);
  uVar6 = f;
  uVar3 = b;
  local_b8 = (uVar18 >> 7 ^
             (uVar18 << 0x38 | uVar18 >> 8) ^ (uVar18 >> 1 | (ulong)((uVar18 & 1) != 0) << 0x3f)) +
             local_b8 + local_c0 +
             (uVar20 >> 6 ^ (uVar20 * 8 | uVar20 >> 0x3d) ^ (uVar20 << 0x2d | uVar20 >> 0x13));
  Round(b,uVar2,uVar8,&e,f,uVar5,uVar7,&a,0xc67178f2e372532b,local_b8);
  uVar4 = a;
  uVar1 = e;
  uVar18 = (uVar9 >> 7 ^
           (uVar9 << 0x38 | uVar9 >> 8) ^ (uVar9 >> 1 | (ulong)((uVar9 & 1) != 0) << 0x3f)) + uVar18
           + uVar14 +
           (uVar17 >> 6 ^ (uVar17 * 8 | uVar17 >> 0x3d) ^ (uVar17 << 0x2d | uVar17 >> 0x13));
  Round(a,uVar3,uVar2,&d,e,uVar6,uVar5,&h,0xca273eceea26619c,uVar18);
  uVar8 = d;
  uVar7 = h;
  uVar24 = (uVar22 >> 7 ^
           (uVar22 << 0x38 | uVar22 >> 8) ^ (uVar22 >> 1 | (ulong)((uVar22 & 1) != 0) << 0x3f)) +
           uVar9 + uVar15 +
           (local_b8 >> 6 ^
           (local_b8 << 3 | local_b8 >> 0x3d) ^ (local_b8 << 0x2d | local_b8 >> 0x13));
  Round(h,uVar4,uVar3,&c,d,uVar1,uVar6,&g,0xd186b8c721c0c207,uVar24);
  uVar5 = g;
  uVar2 = c;
  uVar22 = (uVar10 >> 7 ^
           (uVar10 << 0x38 | uVar10 >> 8) ^ (uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f)) +
           uVar22 + local_90 +
           (uVar18 >> 6 ^ (uVar18 * 8 | uVar18 >> 0x3d) ^ (uVar18 << 0x2d | uVar18 >> 0x13));
  Round(g,uVar7,uVar4,&b,c,uVar8,uVar1,&f,0xeada7dd6cde0eb1e,uVar22);
  uVar6 = f;
  uVar3 = b;
  uVar23 = (uVar11 >> 7 ^
           (uVar11 << 0x38 | uVar11 >> 8) ^ (uVar11 >> 1 | (ulong)((uVar11 & 1) != 0) << 0x3f)) +
           uVar10 + uVar16 +
           (uVar24 >> 6 ^ (uVar24 * 8 | uVar24 >> 0x3d) ^ (uVar24 << 0x2d | uVar24 >> 0x13));
  Round(f,uVar5,uVar7,&a,b,uVar2,uVar8,&e,0xf57d4f7fee6ed178,uVar23);
  uVar4 = a;
  uVar1 = e;
  uVar9 = (uVar19 >> 7 ^
          (uVar19 << 0x38 | uVar19 >> 8) ^ (uVar19 >> 1 | (ulong)((uVar19 & 1) != 0) << 0x3f)) +
          uVar11 + uVar20 +
          (uVar22 >> 6 ^ (uVar22 * 8 | uVar22 >> 0x3d) ^ (uVar22 << 0x2d | uVar22 >> 0x13));
  Round(e,uVar6,uVar5,&h,a,uVar3,uVar2,&d,0x6f067aa72176fba,uVar9);
  uVar8 = d;
  uVar7 = h;
  uVar19 = (uVar12 >> 7 ^
           (uVar12 << 0x38 | uVar12 >> 8) ^ (uVar12 >> 1 | (ulong)((uVar12 & 1) != 0) << 0x3f)) +
           uVar19 + uVar17 +
           (uVar23 >> 6 ^ (uVar23 * 8 | uVar23 >> 0x3d) ^ (uVar23 << 0x2d | uVar23 >> 0x13));
  Round(d,uVar1,uVar6,&g,h,uVar4,uVar3,&c,0xa637dc5a2c898a6,uVar19);
  uVar5 = g;
  uVar2 = c;
  uVar21 = (uVar13 >> 7 ^
           (uVar13 << 0x38 | uVar13 >> 8) ^ (uVar13 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f)) +
           uVar12 + local_b8 +
           (uVar9 >> 6 ^ (uVar9 * 8 | uVar9 >> 0x3d) ^ (uVar9 << 0x2d | uVar9 >> 0x13));
  Round(c,uVar8,uVar1,&f,g,uVar7,uVar4,&b,0x113f9804bef90dae,uVar21);
  uVar6 = f;
  uVar3 = b;
  uVar10 = (local_c0 >> 7 ^
           (local_c0 << 0x38 | local_c0 >> 8) ^
           (local_c0 >> 1 | (ulong)((local_c0 & 1) != 0) << 0x3f)) + uVar13 + uVar18 +
           (uVar19 >> 6 ^ (uVar19 * 8 | uVar19 >> 0x3d) ^ (uVar19 << 0x2d | uVar19 >> 0x13));
  Round(b,uVar2,uVar8,&e,f,uVar5,uVar7,&a,0x1b710b35131c471b,uVar10);
  uVar4 = a;
  uVar1 = e;
  uVar11 = (uVar14 >> 7 ^
           (uVar14 << 0x38 | uVar14 >> 8) ^ (uVar14 >> 1 | (ulong)((uVar14 & 1) != 0) << 0x3f)) +
           local_c0 + uVar24 +
           (uVar21 >> 6 ^ (uVar21 * 8 | uVar21 >> 0x3d) ^ (uVar21 << 0x2d | uVar21 >> 0x13));
  Round(a,uVar3,uVar2,&d,e,uVar6,uVar5,&h,0x28db77f523047d84,uVar11);
  uVar8 = d;
  uVar7 = h;
  uVar12 = (uVar15 >> 7 ^
           (uVar15 << 0x38 | uVar15 >> 8) ^ (uVar15 >> 1 | (ulong)((uVar15 & 1) != 0) << 0x3f)) +
           uVar14 + uVar22 +
           (uVar10 >> 6 ^ (uVar10 * 8 | uVar10 >> 0x3d) ^ (uVar10 << 0x2d | uVar10 >> 0x13));
  Round(h,uVar4,uVar3,&c,d,uVar1,uVar6,&g,0x32caab7b40c72493,uVar12);
  uVar5 = g;
  uVar2 = c;
  uVar13 = (local_90 >> 7 ^
           (local_90 << 0x38 | local_90 >> 8) ^
           (local_90 >> 1 | (ulong)((local_90 & 1) != 0) << 0x3f)) + uVar15 + uVar23 +
           (uVar11 >> 6 ^ (uVar11 * 8 | uVar11 >> 0x3d) ^ (uVar11 << 0x2d | uVar11 >> 0x13));
  local_c0 = c;
  Round(g,uVar7,uVar4,&b,c,uVar8,uVar1,&f,0x3c9ebe0a15c9bebc,uVar13);
  uVar6 = f;
  uVar3 = b;
  uVar12 = (uVar16 >> 7 ^
           (uVar16 << 0x38 | uVar16 >> 8) ^ (uVar16 >> 1 | (ulong)((uVar16 & 1) != 0) << 0x3f)) +
           local_90 + uVar9 +
           (uVar12 >> 6 ^ (uVar12 * 8 | uVar12 >> 0x3d) ^ (uVar12 << 0x2d | uVar12 >> 0x13));
  Round(f,uVar5,uVar7,&a,b,uVar2,uVar8,&e,0x431d67c49c100d4c,uVar12);
  uVar4 = a;
  uVar1 = e;
  uVar9 = (uVar20 >> 7 ^
          (uVar20 << 0x38 | uVar20 >> 8) ^ (uVar20 >> 1 | (ulong)((uVar20 & 1) != 0) << 0x3f)) +
          uVar16 + uVar19 +
          (uVar13 >> 6 ^ (uVar13 * 8 | uVar13 >> 0x3d) ^ (uVar13 << 0x2d | uVar13 >> 0x13));
  Round(e,uVar6,uVar5,&h,a,uVar3,local_c0,&d,0x4cc5d4becb3e42b6,uVar9);
  uVar7 = d;
  uVar5 = h;
  uVar12 = (uVar17 >> 7 ^
           (uVar17 << 0x38 | uVar17 >> 8) ^ (uVar17 >> 1 | (ulong)((uVar17 & 1) != 0) << 0x3f)) +
           uVar20 + uVar21 +
           (uVar12 >> 6 ^ (uVar12 * 8 | uVar12 >> 0x3d) ^ (uVar12 << 0x2d | uVar12 >> 0x13));
  Round(d,uVar1,uVar6,&g,h,uVar4,uVar3,&c,0x597f299cfc657e2a,uVar12);
  uVar3 = g;
  uVar2 = c;
  Round(c,uVar7,uVar1,&f,g,uVar5,uVar4,&b,0x5fcb6fab3ad6faec,
        (local_b8 >> 7 ^
        (local_b8 << 0x38 | local_b8 >> 8) ^ (local_b8 >> 1 | (ulong)((local_b8 & 1) != 0) << 0x3f))
        + uVar17 + uVar10 +
        (uVar9 >> 6 ^ (uVar9 * 8 | uVar9 >> 0x3d) ^ (uVar9 << 0x2d | uVar9 >> 0x13)));
  uVar4 = f;
  uVar1 = b;
  Round(b,uVar2,uVar7,&e,f,uVar3,uVar5,&a,0x6c44198c4a475817,
        (uVar18 >> 7 ^
        (uVar18 << 0x38 | uVar18 >> 8) ^ (uVar18 >> 1 | (ulong)((uVar18 & 1) != 0) << 0x3f)) +
        local_b8 + uVar11 +
        (uVar12 >> 6 ^ (uVar12 * 8 | uVar12 >> 0x3d) ^ (uVar12 << 0x2d | uVar12 >> 0x13)));
  *local_48 = local_70 + a;
  local_48[1] = uVar1 + local_60;
  local_48[2] = uVar2 + local_58;
  local_48[3] = uVar7 + local_38;
  local_48[4] = local_68 + e;
  local_48[5] = uVar4 + local_78;
  local_48[6] = uVar3 + local_50;
  local_48[7] = uVar5 + local_40;
  return;
}

Assistant:

static void Transform(uint64_t *s, const uint64_t *chunk)
{
	uint64_t a = s[0], b = s[1], c = s[2], d = s[3], e = s[4], f = s[5], g = s[6], h = s[7];
	uint64_t w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

	Round(a, b, c, &d, e, f, g, &h, 0x428a2f98d728ae22ull, w0 = be64_to_cpu(chunk[0]));
	Round(h, a, b, &c, d, e, f, &g, 0x7137449123ef65cdull, w1 = be64_to_cpu(chunk[1]));
	Round(g, h, a, &b, c, d, e, &f, 0xb5c0fbcfec4d3b2full, w2 = be64_to_cpu(chunk[2]));
	Round(f, g, h, &a, b, c, d, &e, 0xe9b5dba58189dbbcull, w3 = be64_to_cpu(chunk[3]));
	Round(e, f, g, &h, a, b, c, &d, 0x3956c25bf348b538ull, w4 = be64_to_cpu(chunk[4]));
	Round(d, e, f, &g, h, a, b, &c, 0x59f111f1b605d019ull, w5 = be64_to_cpu(chunk[5]));
	Round(c, d, e, &f, g, h, a, &b, 0x923f82a4af194f9bull, w6 = be64_to_cpu(chunk[6]));
	Round(b, c, d, &e, f, g, h, &a, 0xab1c5ed5da6d8118ull, w7 = be64_to_cpu(chunk[7]));
	Round(a, b, c, &d, e, f, g, &h, 0xd807aa98a3030242ull, w8 = be64_to_cpu(chunk[8]));
	Round(h, a, b, &c, d, e, f, &g, 0x12835b0145706fbeull, w9 = be64_to_cpu(chunk[9]));
	Round(g, h, a, &b, c, d, e, &f, 0x243185be4ee4b28cull, w10 = be64_to_cpu(chunk[10]));
	Round(f, g, h, &a, b, c, d, &e, 0x550c7dc3d5ffb4e2ull, w11 = be64_to_cpu(chunk[11]));
	Round(e, f, g, &h, a, b, c, &d, 0x72be5d74f27b896full, w12 = be64_to_cpu(chunk[12]));
	Round(d, e, f, &g, h, a, b, &c, 0x80deb1fe3b1696b1ull, w13 = be64_to_cpu(chunk[13]));
	Round(c, d, e, &f, g, h, a, &b, 0x9bdc06a725c71235ull, w14 = be64_to_cpu(chunk[14]));
	Round(b, c, d, &e, f, g, h, &a, 0xc19bf174cf692694ull, w15 = be64_to_cpu(chunk[15]));

	Round(a, b, c, &d, e, f, g, &h, 0xe49b69c19ef14ad2ull, w0 += sigma1(w14) + w9 + sigma0(w1));
	Round(h, a, b, &c, d, e, f, &g, 0xefbe4786384f25e3ull, w1 += sigma1(w15) + w10 + sigma0(w2));
	Round(g, h, a, &b, c, d, e, &f, 0x0fc19dc68b8cd5b5ull, w2 += sigma1(w0) + w11 + sigma0(w3));
	Round(f, g, h, &a, b, c, d, &e, 0x240ca1cc77ac9c65ull, w3 += sigma1(w1) + w12 + sigma0(w4));
	Round(e, f, g, &h, a, b, c, &d, 0x2de92c6f592b0275ull, w4 += sigma1(w2) + w13 + sigma0(w5));
	Round(d, e, f, &g, h, a, b, &c, 0x4a7484aa6ea6e483ull, w5 += sigma1(w3) + w14 + sigma0(w6));
	Round(c, d, e, &f, g, h, a, &b, 0x5cb0a9dcbd41fbd4ull, w6 += sigma1(w4) + w15 + sigma0(w7));
	Round(b, c, d, &e, f, g, h, &a, 0x76f988da831153b5ull, w7 += sigma1(w5) + w0 + sigma0(w8));
	Round(a, b, c, &d, e, f, g, &h, 0x983e5152ee66dfabull, w8 += sigma1(w6) + w1 + sigma0(w9));
	Round(h, a, b, &c, d, e, f, &g, 0xa831c66d2db43210ull, w9 += sigma1(w7) + w2 + sigma0(w10));
	Round(g, h, a, &b, c, d, e, &f, 0xb00327c898fb213full, w10 += sigma1(w8) + w3 + sigma0(w11));
	Round(f, g, h, &a, b, c, d, &e, 0xbf597fc7beef0ee4ull, w11 += sigma1(w9) + w4 + sigma0(w12));
	Round(e, f, g, &h, a, b, c, &d, 0xc6e00bf33da88fc2ull, w12 += sigma1(w10) + w5 + sigma0(w13));
	Round(d, e, f, &g, h, a, b, &c, 0xd5a79147930aa725ull, w13 += sigma1(w11) + w6 + sigma0(w14));
	Round(c, d, e, &f, g, h, a, &b, 0x06ca6351e003826full, w14 += sigma1(w12) + w7 + sigma0(w15));
	Round(b, c, d, &e, f, g, h, &a, 0x142929670a0e6e70ull, w15 += sigma1(w13) + w8 + sigma0(w0));

	Round(a, b, c, &d, e, f, g, &h, 0x27b70a8546d22ffcull, w0 += sigma1(w14) + w9 + sigma0(w1));
	Round(h, a, b, &c, d, e, f, &g, 0x2e1b21385c26c926ull, w1 += sigma1(w15) + w10 + sigma0(w2));
	Round(g, h, a, &b, c, d, e, &f, 0x4d2c6dfc5ac42aedull, w2 += sigma1(w0) + w11 + sigma0(w3));
	Round(f, g, h, &a, b, c, d, &e, 0x53380d139d95b3dfull, w3 += sigma1(w1) + w12 + sigma0(w4));
	Round(e, f, g, &h, a, b, c, &d, 0x650a73548baf63deull, w4 += sigma1(w2) + w13 + sigma0(w5));
	Round(d, e, f, &g, h, a, b, &c, 0x766a0abb3c77b2a8ull, w5 += sigma1(w3) + w14 + sigma0(w6));
	Round(c, d, e, &f, g, h, a, &b, 0x81c2c92e47edaee6ull, w6 += sigma1(w4) + w15 + sigma0(w7));
	Round(b, c, d, &e, f, g, h, &a, 0x92722c851482353bull, w7 += sigma1(w5) + w0 + sigma0(w8));
	Round(a, b, c, &d, e, f, g, &h, 0xa2bfe8a14cf10364ull, w8 += sigma1(w6) + w1 + sigma0(w9));
	Round(h, a, b, &c, d, e, f, &g, 0xa81a664bbc423001ull, w9 += sigma1(w7) + w2 + sigma0(w10));
	Round(g, h, a, &b, c, d, e, &f, 0xc24b8b70d0f89791ull, w10 += sigma1(w8) + w3 + sigma0(w11));
	Round(f, g, h, &a, b, c, d, &e, 0xc76c51a30654be30ull, w11 += sigma1(w9) + w4 + sigma0(w12));
	Round(e, f, g, &h, a, b, c, &d, 0xd192e819d6ef5218ull, w12 += sigma1(w10) + w5 + sigma0(w13));
	Round(d, e, f, &g, h, a, b, &c, 0xd69906245565a910ull, w13 += sigma1(w11) + w6 + sigma0(w14));
	Round(c, d, e, &f, g, h, a, &b, 0xf40e35855771202aull, w14 += sigma1(w12) + w7 + sigma0(w15));
	Round(b, c, d, &e, f, g, h, &a, 0x106aa07032bbd1b8ull, w15 += sigma1(w13) + w8 + sigma0(w0));

	Round(a, b, c, &d, e, f, g, &h, 0x19a4c116b8d2d0c8ull, w0 += sigma1(w14) + w9 + sigma0(w1));
	Round(h, a, b, &c, d, e, f, &g, 0x1e376c085141ab53ull, w1 += sigma1(w15) + w10 + sigma0(w2));
	Round(g, h, a, &b, c, d, e, &f, 0x2748774cdf8eeb99ull, w2 += sigma1(w0) + w11 + sigma0(w3));
	Round(f, g, h, &a, b, c, d, &e, 0x34b0bcb5e19b48a8ull, w3 += sigma1(w1) + w12 + sigma0(w4));
	Round(e, f, g, &h, a, b, c, &d, 0x391c0cb3c5c95a63ull, w4 += sigma1(w2) + w13 + sigma0(w5));
	Round(d, e, f, &g, h, a, b, &c, 0x4ed8aa4ae3418acbull, w5 += sigma1(w3) + w14 + sigma0(w6));
	Round(c, d, e, &f, g, h, a, &b, 0x5b9cca4f7763e373ull, w6 += sigma1(w4) + w15 + sigma0(w7));
	Round(b, c, d, &e, f, g, h, &a, 0x682e6ff3d6b2b8a3ull, w7 += sigma1(w5) + w0 + sigma0(w8));
	Round(a, b, c, &d, e, f, g, &h, 0x748f82ee5defb2fcull, w8 += sigma1(w6) + w1 + sigma0(w9));
	Round(h, a, b, &c, d, e, f, &g, 0x78a5636f43172f60ull, w9 += sigma1(w7) + w2 + sigma0(w10));
	Round(g, h, a, &b, c, d, e, &f, 0x84c87814a1f0ab72ull, w10 += sigma1(w8) + w3 + sigma0(w11));
	Round(f, g, h, &a, b, c, d, &e, 0x8cc702081a6439ecull, w11 += sigma1(w9) + w4 + sigma0(w12));
	Round(e, f, g, &h, a, b, c, &d, 0x90befffa23631e28ull, w12 += sigma1(w10) + w5 + sigma0(w13));
	Round(d, e, f, &g, h, a, b, &c, 0xa4506cebde82bde9ull, w13 += sigma1(w11) + w6 + sigma0(w14));
	Round(c, d, e, &f, g, h, a, &b, 0xbef9a3f7b2c67915ull, w14 += sigma1(w12) + w7 + sigma0(w15));
	Round(b, c, d, &e, f, g, h, &a, 0xc67178f2e372532bull, w15 += sigma1(w13) + w8 + sigma0(w0));

	Round(a, b, c, &d, e, f, g, &h, 0xca273eceea26619cull, w0 += sigma1(w14) + w9 + sigma0(w1));
	Round(h, a, b, &c, d, e, f, &g, 0xd186b8c721c0c207ull, w1 += sigma1(w15) + w10 + sigma0(w2));
	Round(g, h, a, &b, c, d, e, &f, 0xeada7dd6cde0eb1eull, w2 += sigma1(w0) + w11 + sigma0(w3));
	Round(f, g, h, &a, b, c, d, &e, 0xf57d4f7fee6ed178ull, w3 += sigma1(w1) + w12 + sigma0(w4));
	Round(e, f, g, &h, a, b, c, &d, 0x06f067aa72176fbaull, w4 += sigma1(w2) + w13 + sigma0(w5));
	Round(d, e, f, &g, h, a, b, &c, 0x0a637dc5a2c898a6ull, w5 += sigma1(w3) + w14 + sigma0(w6));
	Round(c, d, e, &f, g, h, a, &b, 0x113f9804bef90daeull, w6 += sigma1(w4) + w15 + sigma0(w7));
	Round(b, c, d, &e, f, g, h, &a, 0x1b710b35131c471bull, w7 += sigma1(w5) + w0 + sigma0(w8));
	Round(a, b, c, &d, e, f, g, &h, 0x28db77f523047d84ull, w8 += sigma1(w6) + w1 + sigma0(w9));
	Round(h, a, b, &c, d, e, f, &g, 0x32caab7b40c72493ull, w9 += sigma1(w7) + w2 + sigma0(w10));
	Round(g, h, a, &b, c, d, e, &f, 0x3c9ebe0a15c9bebcull, w10 += sigma1(w8) + w3 + sigma0(w11));
	Round(f, g, h, &a, b, c, d, &e, 0x431d67c49c100d4cull, w11 += sigma1(w9) + w4 + sigma0(w12));
	Round(e, f, g, &h, a, b, c, &d, 0x4cc5d4becb3e42b6ull, w12 += sigma1(w10) + w5 + sigma0(w13));
	Round(d, e, f, &g, h, a, b, &c, 0x597f299cfc657e2aull, w13 += sigma1(w11) + w6 + sigma0(w14));
	Round(c, d, e, &f, g, h, a, &b, 0x5fcb6fab3ad6faecull, w14 + sigma1(w12) + w7 + sigma0(w15));
	Round(b, c, d, &e, f, g, h, &a, 0x6c44198c4a475817ull, w15 + sigma1(w13) + w8 + sigma0(w0));

	s[0] += a;
	s[1] += b;
	s[2] += c;
	s[3] += d;
	s[4] += e;
	s[5] += f;
	s[6] += g;
	s[7] += h;
}